

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O1

QList<int> * __thiscall
QVersionNumber::segments(QList<int> *__return_storage_ptr__,QVersionNumber *this)

{
  byte bVar1;
  QList<int> *pQVar2;
  Data *pDVar3;
  pointer piVar4;
  long lVar5;
  int iVar6;
  qsizetype i;
  long lVar7;
  
  bVar1 = (this->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    pQVar2 = (this->m_segments).field_0.pointer_segments;
    pDVar3 = (pQVar2->d).d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = (pQVar2->d).ptr;
    (__return_storage_ptr__->d).size = (pQVar2->d).size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QList<int>::resize(__return_storage_ptr__,(long)((char)bVar1 >> 1));
    lVar7 = 0;
    while( true ) {
      bVar1 = (this->m_segments).field_0.inline_segments[0];
      if ((bVar1 & 1) == 0) {
        lVar5 = (((this->m_segments).field_0.pointer_segments)->d).size;
      }
      else {
        lVar5 = (long)((char)bVar1 >> 1);
      }
      if (lVar5 <= lVar7) break;
      if ((bVar1 & 1) == 0) {
        lVar5 = (((this->m_segments).field_0.pointer_segments)->d).size;
      }
      else {
        lVar5 = (long)((char)bVar1 >> 1);
      }
      iVar6 = 0;
      if (lVar7 < lVar5) {
        if ((bVar1 & 1) == 0) {
          iVar6 = (((this->m_segments).field_0.pointer_segments)->d).ptr[lVar7];
        }
        else {
          iVar6 = (int)(this->m_segments).field_0.inline_segments[lVar7 + 1];
        }
      }
      piVar4 = QList<int>::data(__return_storage_ptr__);
      piVar4[lVar7] = iVar6;
      lVar7 = lVar7 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QVersionNumber::segments() const
{
    if (m_segments.isUsingPointer())
        return *m_segments.pointer_segments;

    QList<int> result;
    result.resize(segmentCount());
    for (qsizetype i = 0; i < segmentCount(); ++i)
        result[i] = segmentAt(i);
    return result;
}